

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

void __thiscall
zmq::mechanism_t::make_command_with_basic_properties
          (mechanism_t *this,msg_t *msg_,char *prefix_,size_t prefix_len_)

{
  int iVar1;
  size_t sVar2;
  void *__dest;
  void *pvVar3;
  
  sVar2 = basic_properties_len(this);
  iVar1 = msg_t::init_size(msg_,sVar2 + prefix_len_);
  if (iVar1 != 0) {
    make_command_with_basic_properties();
  }
  __dest = msg_t::data(msg_);
  memcpy(__dest,prefix_,prefix_len_);
  pvVar3 = msg_t::data(msg_);
  add_basic_properties
            (this,(uchar *)((long)__dest + prefix_len_),
             ((sVar2 + prefix_len_) - (long)((long)__dest + prefix_len_)) + (long)pvVar3);
  return;
}

Assistant:

void zmq::mechanism_t::make_command_with_basic_properties (
  msg_t *msg_, const char *prefix_, size_t prefix_len_) const
{
    const size_t command_size = prefix_len_ + basic_properties_len ();
    const int rc = msg_->init_size (command_size);
    errno_assert (rc == 0);

    unsigned char *ptr = static_cast<unsigned char *> (msg_->data ());

    //  Add prefix
    memcpy (ptr, prefix_, prefix_len_);
    ptr += prefix_len_;

    add_basic_properties (
      ptr, command_size - (ptr - static_cast<unsigned char *> (msg_->data ())));
}